

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O3

Vec_Str_t * Gia_AigerWriteMappingDoc(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  byte bVar7;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  char *pcVar15;
  Vec_Str_t *pVVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  
  iVar21 = p->nObjs;
  uVar25 = (ulong)iVar21;
  uVar24 = 0;
  iVar22 = 2;
  uVar18 = 0;
  iVar23 = 2;
  if (1 < (long)uVar25) {
    uVar2 = p->vMapping->nSize;
    uVar17 = 1;
    if (1 < (int)uVar2) {
      uVar17 = (ulong)uVar2;
    }
    uVar18 = 0;
    iVar23 = 2;
    uVar19 = 1;
    uVar24 = 0;
    do {
      if (uVar17 == uVar19) goto LAB_001d56a2;
      piVar5 = p->vMapping->pArray;
      uVar3 = piVar5[uVar19];
      uVar4 = uVar18;
      if ((ulong)uVar3 != 0) {
        if (((int)uVar3 < 0) || (uVar2 <= uVar3)) goto LAB_001d56a2;
        uVar24 = uVar24 + 1;
        uVar4 = piVar5[uVar3];
        iVar23 = iVar23 + uVar4 + 2;
        if ((int)uVar4 < (int)uVar18) {
          uVar4 = uVar18;
        }
      }
      uVar18 = uVar4;
      uVar19 = uVar19 + 1;
    } while (uVar25 != uVar19);
  }
  iVar1 = iVar23 * 4;
  pcVar15 = (char *)malloc((long)iVar1);
  uVar12 = (ushort)(uVar24 >> 0x10) & 0xff;
  uVar13 = (ushort)(uVar24 >> 8) & 0xff;
  uVar14 = (ushort)uVar24 & 0xff;
  bVar8 = (byte)(uVar24 >> 0x18);
  uVar11 = (ushort)bVar8;
  bVar7 = (uVar11 != 0) * (uVar11 < 0x100) * bVar8 - (0xff < uVar11);
  bVar8 = ((uVar24 & 0xff0000) != 0) * (uVar12 < 0x100) * (char)(uVar24 >> 0x10) - (0xff < uVar12);
  bVar9 = ((uVar24 & 0xff00) != 0) * (uVar13 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar13);
  bVar10 = ((uVar24 & 0xff) != 0) * (uVar14 < 0x100) * (char)uVar24 - (0xff < uVar14);
  *(uint *)pcVar15 =
       CONCAT13((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10),
                CONCAT12((bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9),
                         CONCAT11((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                                  (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7))));
  uVar12 = (ushort)(uVar18 >> 0x10) & 0xff;
  uVar13 = (ushort)(uVar18 >> 8) & 0xff;
  uVar14 = (ushort)uVar18 & 0xff;
  bVar8 = (byte)(uVar18 >> 0x18);
  uVar11 = (ushort)bVar8;
  bVar8 = (uVar11 != 0) * (uVar11 < 0x100) * bVar8 - (0xff < uVar11);
  bVar9 = ((uVar18 & 0xff0000) != 0) * (uVar12 < 0x100) * (char)(uVar18 >> 0x10) - (0xff < uVar12);
  bVar10 = ((uVar18 & 0xff00) != 0) * (uVar13 < 0x100) * (char)(uVar18 >> 8) - (0xff < uVar13);
  bVar7 = ((uVar18 & 0xff) != 0) * (uVar14 < 0x100) * (char)uVar18 - (0xff < uVar14);
  *(uint *)(pcVar15 + 4) =
       CONCAT13((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                CONCAT12((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10),
                         CONCAT11((bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9),
                                  (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8))));
  if (1 < iVar21) {
    pVVar6 = p->vMapping;
    uVar18 = pVVar6->nSize;
    iVar22 = 2;
    uVar17 = 1;
    do {
      if ((long)(int)uVar18 <= (long)uVar17) {
LAB_001d56a2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar5 = pVVar6->pArray;
      uVar24 = piVar5[uVar17];
      uVar19 = (ulong)uVar24;
      if (uVar19 != 0) {
        iVar21 = iVar22 * 4;
        uVar12 = (ushort)(uVar17 >> 0x10) & 0xff;
        uVar13 = (ushort)(uVar17 >> 8) & 0xff;
        uVar14 = (ushort)uVar17 & 0xff;
        bVar8 = (byte)(uVar17 >> 0x18);
        uVar11 = (ushort)bVar8;
        bVar8 = (uVar11 != 0) * (uVar11 < 0x100) * bVar8 - (0xff < uVar11);
        bVar9 = ((uVar17 & 0xff0000) != 0) * (uVar12 < 0x100) * (char)(uVar17 >> 0x10) -
                (0xff < uVar12);
        bVar10 = ((uVar17 & 0xff00) != 0) * (uVar13 < 0x100) * (char)(uVar17 >> 8) - (0xff < uVar13)
        ;
        bVar7 = ((uVar17 & 0xff) != 0) * (uVar14 < 0x100) * (char)uVar17 - (0xff < uVar14);
        *(uint *)(pcVar15 + iVar21) =
             CONCAT13((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                      CONCAT12((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10),
                               CONCAT11((bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9),
                                        (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8))));
        if (((int)uVar24 < 0) || (uVar18 <= uVar24)) goto LAB_001d56a2;
        iVar22 = iVar22 + 2;
        uVar24 = piVar5[uVar19];
        uVar12 = (ushort)(uVar24 >> 0x10) & 0xff;
        uVar13 = (ushort)(uVar24 >> 8) & 0xff;
        uVar14 = (ushort)uVar24 & 0xff;
        bVar8 = (byte)(uVar24 >> 0x18);
        uVar11 = (ushort)bVar8;
        bVar8 = (uVar11 != 0) * (uVar11 < 0x100) * bVar8 - (0xff < uVar11);
        bVar7 = ((uVar24 & 0xff0000) != 0) * (uVar12 < 0x100) * (char)(uVar24 >> 0x10) -
                (0xff < uVar12);
        bVar10 = ((uVar24 & 0xff00) != 0) * (uVar13 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar13)
        ;
        bVar9 = ((uVar24 & 0xff) != 0) * (uVar14 < 0x100) * (char)uVar24 - (0xff < uVar14);
        *(uint *)(pcVar15 + (iVar21 + 4)) =
             CONCAT13((bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9),
                      CONCAT12((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10),
                               CONCAT11((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                                        (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8))));
        if (0 < (long)(int)uVar24) {
          lVar20 = 0;
          do {
            uVar2 = piVar5[uVar19 + lVar20 + 1];
            uVar12 = (ushort)(uVar2 >> 0x10) & 0xff;
            uVar13 = (ushort)(uVar2 >> 8) & 0xff;
            uVar14 = (ushort)uVar2 & 0xff;
            bVar8 = (byte)(uVar2 >> 0x18);
            uVar11 = (ushort)bVar8;
            bVar8 = (uVar11 != 0) * (uVar11 < 0x100) * bVar8 - (0xff < uVar11);
            bVar9 = ((uVar2 & 0xff0000) != 0) * (uVar12 < 0x100) * (char)(uVar2 >> 0x10) -
                    (0xff < uVar12);
            bVar10 = ((uVar2 & 0xff00) != 0) * (uVar13 < 0x100) * (char)(uVar2 >> 8) -
                     (0xff < uVar13);
            bVar7 = ((uVar2 & 0xff) != 0) * (uVar14 < 0x100) * (char)uVar2 - (0xff < uVar14);
            *(uint *)(pcVar15 + lVar20 * 4 + (long)iVar22 * 4) =
                 CONCAT13((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                          CONCAT12((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10),
                                   CONCAT11((bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9),
                                            (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8))
                                  ));
            lVar20 = lVar20 + 1;
          } while (lVar20 < (int)uVar24);
          iVar22 = iVar22 + (int)lVar20;
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar25);
  }
  if (iVar22 != iVar23) {
    __assert_fail("nSize2 == nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAigerExt.c"
                  ,0x11f,"Vec_Str_t *Gia_AigerWriteMappingDoc(Gia_Man_t *)");
  }
  pVVar16 = (Vec_Str_t *)malloc(0x10);
  pVVar16->nSize = iVar1;
  pVVar16->nCap = iVar1;
  pVVar16->pArray = pcVar15;
  return pVVar16;
}

Assistant:

Vec_Str_t * Gia_AigerWriteMappingDoc( Gia_Man_t * p )
{
    unsigned char * pBuffer;
    int i, k, iFan, nLuts = 0, LutSize = 0, nSize = 2, nSize2 = 0;
    Gia_ManForEachLut( p, i )
    {
        nLuts++;
        nSize += Gia_ObjLutSize(p, i) + 2;
        LutSize = Abc_MaxInt( LutSize, Gia_ObjLutSize(p, i) );
    }
    pBuffer = ABC_ALLOC( unsigned char, 4 * nSize );
    Gia_AigerWriteInt( pBuffer + 4 * nSize2++, nLuts );  
    Gia_AigerWriteInt( pBuffer + 4 * nSize2++, LutSize );
    Gia_ManForEachLut( p, i )
    {
        Gia_AigerWriteInt( pBuffer + 4 * nSize2++, i );
        Gia_AigerWriteInt( pBuffer + 4 * nSize2++, Gia_ObjLutSize(p, i) );
        Gia_LutForEachFanin( p, i, iFan, k )
            Gia_AigerWriteInt( pBuffer + 4 * nSize2++, iFan );
    }
    assert( nSize2 == nSize );
    return Vec_StrAllocArray( (char *)pBuffer, 4*nSize );
}